

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readStats_body_bmi2
                 (BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,U32 *tableLogPtr,
                 void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *in_RCX;
  void *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint *in_R8;
  byte *in_R9;
  ulong in_stack_00000008;
  U32 lastWeight;
  U32 verif;
  U32 rest;
  U32 total;
  U32 tableLog;
  U32 n_1;
  U32 n;
  size_t oSize;
  size_t iSize;
  BYTE *ip;
  U32 weightTotal;
  undefined4 in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  uint local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  int local_58;
  size_t local_8;
  
  if (in_stack_00000008 == 0) {
    return 0xffffffffffffffb8;
  }
  local_68 = (ulong)*in_R9;
  if (local_68 < 0x80) {
    if (in_stack_00000008 < local_68 + 1) {
      return 0xffffffffffffffb8;
    }
    local_70 = FSE_decompress_wksp_bmi2
                         (in_RDX,(size_t)in_RCX,in_R8,(size_t)in_R9,in_stack_ffffffffffffff3c,
                          (void *)CONCAT44(in_stack_ffffffffffffff34,1),
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff78);
    uVar1 = FSE_isError(0x1d63ff);
    if (uVar1 != 0) {
      return local_70;
    }
  }
  else {
    local_70 = local_68 - 0x7f;
    local_68 = local_68 - 0x7e >> 1;
    if (in_stack_00000008 < local_68 + 1) {
      return 0xffffffffffffffb8;
    }
    if (in_RSI <= local_70) {
      return 0xffffffffffffffec;
    }
    for (local_74 = 0; local_74 < local_70; local_74 = local_74 + 2) {
      *(char *)(in_RDI + (ulong)local_74) =
           (char)((int)(uint)in_R9[(ulong)(local_74 >> 1) + 1] >> 4);
      *(byte *)(in_RDI + (ulong)(local_74 + 1)) = in_R9[(ulong)(local_74 >> 1) + 1] & 0xf;
    }
  }
  memset(in_RDX,0,0x34);
  local_58 = 0;
  local_78 = 0;
  while( true ) {
    if (local_70 <= local_78) {
      if (local_58 == 0) {
        local_8 = 0xffffffffffffffec;
      }
      else {
        uVar1 = ZSTD_highbit32(0);
        uVar1 = uVar1 + 1;
        if (uVar1 < 0xd) {
          *in_R8 = uVar1;
          uVar2 = ZSTD_highbit32(0);
          iVar3 = 1 << ((byte)uVar2 & 0x1f);
          uVar2 = ZSTD_highbit32(0);
          uVar2 = uVar2 + 1;
          if (iVar3 == (1 << ((byte)uVar1 & 0x1f)) - local_58) {
            *(char *)(in_RDI + local_70) = (char)uVar2;
            *(int *)((long)in_RDX + (ulong)uVar2 * 4) =
                 *(int *)((long)in_RDX + (ulong)uVar2 * 4) + 1;
            if ((*(uint *)((long)in_RDX + 4) < 2) || ((*(uint *)((long)in_RDX + 4) & 1) != 0)) {
              local_8 = 0xffffffffffffffec;
            }
            else {
              *in_RCX = (int)local_70 + 1;
              local_8 = local_68 + 1;
            }
          }
          else {
            local_8 = 0xffffffffffffffec;
          }
        }
        else {
          local_8 = 0xffffffffffffffec;
        }
      }
      return local_8;
    }
    if (0xc < *(byte *)(in_RDI + (ulong)local_78)) break;
    *(int *)((long)in_RDX + (ulong)*(byte *)(in_RDI + (ulong)local_78) * 4) =
         *(int *)((long)in_RDX + (ulong)*(byte *)(in_RDI + (ulong)local_78) * 4) + 1;
    local_58 = ((1 << (*(byte *)(in_RDI + (ulong)local_78) & 0x1f)) >> 1) + local_58;
    local_78 = local_78 + 1;
  }
  return 0xffffffffffffffec;
}

Assistant:

static BMI2_TARGET_ATTRIBUTE size_t HUF_readStats_body_bmi2(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize)
{
    return HUF_readStats_body(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize, 1);
}